

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

void __thiscall MemoryMappedFile::MemoryMappedFile(MemoryMappedFile *this,MemoryMappedFile *f_other)

{
  MemoryMappedFile *f_other_local;
  MemoryMappedFile *this_local;
  
  Path::Path(&this->mFilename);
  operator=(this,f_other);
  return;
}

Assistant:

MemoryMappedFile::MemoryMappedFile(MemoryMappedFile&& f_other)
{
    *this = std::move(f_other);
}